

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O3

int luv_getaddrinfo(lua_State *L)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *service;
  lua_Integer lVar4;
  char *pcVar5;
  uv_getaddrinfo_t *req;
  luv_req_t *plVar6;
  uv_loop_t *loop;
  code *cb;
  addrinfo *hints;
  uint uVar7;
  uint uVar8;
  addrinfo *hints_00;
  addrinfo hints_s;
  addrinfo local_68;
  
  hints_00 = &local_68;
  iVar1 = lua_type(L,1);
  if (iVar1 < 1) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = luaL_checklstring(L,1,(size_t *)0x0);
  }
  iVar1 = lua_type(L,2);
  if (iVar1 < 1) {
    service = (char *)0x0;
  }
  else {
    service = luaL_checklstring(L,2,(size_t *)0x0);
  }
  iVar1 = lua_type(L,3);
  if (iVar1 < 1) {
    hints_00 = (addrinfo *)0x0;
    goto LAB_0014e3e9;
  }
  luaL_checktype(L,3,5);
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_flags = 0;
  local_68.ai_family = 0;
  local_68.ai_socktype = 0;
  local_68.ai_protocol = 0;
  lua_getfield(L,3,"family");
  iVar1 = lua_isnumber(L,-1);
  if (iVar1 == 0) {
    iVar1 = lua_isstring(L,-1);
    if (iVar1 == 0) {
      iVar1 = lua_type(L,-1);
      if (iVar1 == 0) {
        local_68._0_8_ = local_68._0_8_ & 0xffffffff;
      }
      else {
        luaL_argerror(L,3,"family hint must be string if set");
      }
    }
    else {
      pcVar5 = lua_tolstring(L,-1,(size_t *)0x0);
      iVar1 = luv_af_string_to_num(pcVar5);
      local_68.ai_family = iVar1;
    }
  }
  else {
    lVar4 = lua_tointegerx(L,-1,(int *)0x0);
    local_68.ai_family = (int)lVar4;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"socktype");
  iVar1 = lua_isnumber(L,-1);
  if (iVar1 == 0) {
    iVar1 = lua_isstring(L,-1);
    if (iVar1 != 0) {
      iVar1 = 0;
      pcVar5 = lua_tolstring(L,-1,(size_t *)0x0);
      if (pcVar5 != (char *)0x0) {
        iVar1 = strcmp(pcVar5,"stream");
        if (iVar1 == 0) {
          iVar1 = 1;
        }
        else {
          iVar1 = strcmp(pcVar5,"dgram");
          if (iVar1 == 0) {
            iVar1 = 2;
          }
          else {
            iVar1 = strcmp(pcVar5,"seqpacket");
            if (iVar1 == 0) {
              iVar1 = 5;
            }
            else {
              iVar1 = strcmp(pcVar5,"raw");
              if (iVar1 == 0) {
                iVar1 = 3;
              }
              else {
                iVar1 = strcmp(pcVar5,"rdm");
                iVar1 = (uint)(iVar1 == 0) << 2;
              }
            }
          }
        }
      }
      goto LAB_0014e101;
    }
    iVar1 = lua_type(L,-1);
    if (iVar1 != 0) {
      pcVar3 = "socktype hint must be string if set";
      goto LAB_0014e4fa;
    }
  }
  else {
    lVar4 = lua_tointegerx(L,-1,(int *)0x0);
    iVar1 = (int)lVar4;
LAB_0014e101:
    local_68.ai_socktype = iVar1;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"protocol");
  iVar1 = lua_isnumber(L,-1);
  if (iVar1 == 0) {
    iVar1 = lua_isstring(L,-1);
    if (iVar1 != 0) {
      pcVar5 = lua_tolstring(L,-1,(size_t *)0x0);
      iVar1 = luv_af_string_to_num(pcVar5);
      if (iVar1 == 0) {
        pcVar3 = "Invalid protocol hint";
LAB_0014e4fa:
        iVar1 = luaL_argerror(L,3,pcVar3);
        return iVar1;
      }
      goto LAB_0014e14b;
    }
    iVar1 = lua_type(L,-1);
    if (iVar1 != 0) {
      pcVar3 = "protocol hint must be string if set";
      goto LAB_0014e4fa;
    }
  }
  else {
    lVar4 = lua_tointegerx(L,-1,(int *)0x0);
    iVar1 = (int)lVar4;
LAB_0014e14b:
    local_68.ai_protocol = iVar1;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"addrconfig");
  iVar1 = lua_toboolean(L,-1);
  if (iVar1 == 0) {
    uVar8 = 0;
  }
  else {
    local_68.ai_flags = 0x20;
    uVar8 = 0x20;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"v4mapped");
  iVar1 = lua_toboolean(L,-1);
  uVar7 = uVar8;
  if (iVar1 != 0) {
    uVar7 = uVar8 | 8;
    local_68._0_8_ = CONCAT44(local_68.ai_family,uVar8) | 8;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"all");
  iVar1 = lua_toboolean(L,-1);
  uVar8 = uVar7;
  if (iVar1 != 0) {
    uVar8 = uVar7 | 0x10;
    local_68._0_8_ = CONCAT44(local_68.ai_family,uVar7) | 0x10;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"numerichost");
  iVar1 = lua_toboolean(L,-1);
  uVar7 = uVar8;
  if (iVar1 != 0) {
    uVar7 = uVar8 | 4;
    local_68._0_8_ = CONCAT44(local_68.ai_family,uVar8) | 4;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"passive");
  iVar1 = lua_toboolean(L,-1);
  uVar8 = uVar7;
  if (iVar1 != 0) {
    uVar8 = uVar7 | 1;
    local_68._0_8_ = CONCAT44(local_68.ai_family,uVar7) | 1;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"numericserv");
  iVar1 = lua_toboolean(L,-1);
  uVar7 = uVar8;
  if (iVar1 != 0) {
    uVar7 = uVar8 | 0x400;
    local_68._0_8_ = CONCAT44(local_68.ai_family,uVar8) | 0x400;
    if (service == (char *)0x0) {
      service = "00";
    }
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"canonname");
  iVar1 = lua_toboolean(L,-1);
  if (iVar1 != 0) {
    local_68._0_8_ = CONCAT44(local_68.ai_family,uVar7) | 2;
  }
  lua_settop(L,-2);
LAB_0014e3e9:
  iVar1 = luv_check_continuation(L,4);
  req = (uv_getaddrinfo_t *)lua_newuserdata(L,0xa0);
  plVar6 = luv_setup_req(L,iVar1);
  req->data = plVar6;
  loop = luv_loop(L);
  cb = (uv_getaddrinfo_cb)0x0;
  if (iVar1 != -2) {
    cb = luv_getaddrinfo_cb;
  }
  iVar2 = uv_getaddrinfo(loop,req,cb,pcVar3,service,hints_00);
  if (iVar2 < 0) {
    luv_cleanup_req(L,(luv_req_t *)req->data);
    lua_settop(L,-2);
    luv_error(L,iVar2);
    iVar2 = 3;
  }
  else {
    iVar2 = 1;
    if (iVar1 == -2) {
      lua_settop(L,-2);
      luv_pushaddrinfo(L,req->addrinfo);
      uv_freeaddrinfo(req->addrinfo);
      luv_cleanup_req(L,(luv_req_t *)req->data);
    }
  }
  return iVar2;
}

Assistant:

static int luv_getaddrinfo(lua_State* L) {
  uv_getaddrinfo_t* req;
  const char* node;
  const char* service;
  struct addrinfo hints_s;
  struct addrinfo* hints = &hints_s;
  int ret, ref;
  luv_ctx_t* ctx = luv_context(L);
  if (lua_isnoneornil(L, 1)) node = NULL;
  else node = luaL_checkstring(L, 1);
  if (lua_isnoneornil(L, 2)) service = NULL;
  else service = luaL_checkstring(L, 2);
  if (!lua_isnoneornil(L, 3)) luaL_checktype(L, 3, LUA_TTABLE);
  else hints = NULL;
  if (hints) {
    // Initialize the hints
    memset(hints, 0, sizeof(*hints));

    // Process the `family` hint.
    lua_getfield(L, 3, "family");
    if (lua_isnumber(L, -1)) {
      hints->ai_family = lua_tointeger(L, -1);
    }
    else if (lua_isstring(L, -1)) {
      hints->ai_family = luv_af_string_to_num(lua_tostring(L, -1));
    }
    else if (lua_isnil(L, -1)) {
      hints->ai_family = AF_UNSPEC;
    }
    else {
      luaL_argerror(L, 3, "family hint must be string if set");
    }
    lua_pop(L, 1);

    // Process `socktype` hint
    lua_getfield(L, 3, "socktype");
    if (lua_isnumber(L, -1)) {
      hints->ai_socktype = lua_tointeger(L, -1);
    }
    else if (lua_isstring(L, -1)) {
      hints->ai_socktype = luv_sock_string_to_num(lua_tostring(L, -1));
    }
    else if (!lua_isnil(L, -1)) {
      return luaL_argerror(L, 3, "socktype hint must be string if set");
    }
    lua_pop(L, 1);

    // Process the `protocol` hint
    lua_getfield(L, 3, "protocol");
    if (lua_isnumber(L, -1)) {
      hints->ai_protocol = lua_tointeger(L, -1);
    }
    else if (lua_isstring(L, -1)) {
      int protocol = luv_af_string_to_num(lua_tostring(L, -1));
      if (protocol) {
        hints->ai_protocol = protocol;
      }
      else {
        return luaL_argerror(L, 3, "Invalid protocol hint");
      }
    }
    else if (!lua_isnil(L, -1)) {
      return luaL_argerror(L, 3, "protocol hint must be string if set");
    }
    lua_pop(L, 1);

    lua_getfield(L, 3, "addrconfig");
    if (lua_toboolean(L, -1)) hints->ai_flags |=  AI_ADDRCONFIG;
    lua_pop(L, 1);

#ifdef AI_V4MAPPED
    lua_getfield(L, 3, "v4mapped");
    if (lua_toboolean(L, -1)) hints->ai_flags |=  AI_V4MAPPED;
    lua_pop(L, 1);
#endif

#ifdef AI_ALL
    lua_getfield(L, 3, "all");
    if (lua_toboolean(L, -1)) hints->ai_flags |=  AI_ALL;
    lua_pop(L, 1);
#endif

    lua_getfield(L, 3, "numerichost");
    if (lua_toboolean(L, -1)) hints->ai_flags |=  AI_NUMERICHOST;
    lua_pop(L, 1);

    lua_getfield(L, 3, "passive");
    if (lua_toboolean(L, -1)) hints->ai_flags |=  AI_PASSIVE;
    lua_pop(L, 1);

    lua_getfield(L, 3, "numericserv");
    if (lua_toboolean(L, -1)) {
        hints->ai_flags |=  AI_NUMERICSERV;
        /* On OS X upto at least OSX 10.9, getaddrinfo crashes
         * if AI_NUMERICSERV is set and the servname is NULL or "0".
         * This workaround avoids a segfault in libsystem.
         */
        if (NULL == service) service = "00";
    }
    lua_pop(L, 1);

    lua_getfield(L, 3, "canonname");
    if (lua_toboolean(L, -1)) hints->ai_flags |=  AI_CANONNAME;
    lua_pop(L, 1);
  }

  ref = luv_check_continuation(L, 4);
  req = (uv_getaddrinfo_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);

  ret = uv_getaddrinfo(ctx->loop, req, ref == LUA_NOREF ? NULL : luv_getaddrinfo_cb, node, service, hints);
  if (ret < 0) {
    luv_cleanup_req(L, (luv_req_t*)req->data);
    lua_pop(L, 1);
    return luv_error(L, ret);
  }
  if (ref == LUA_NOREF) {

    lua_pop(L, 1);
    luv_pushaddrinfo(L, req->addrinfo);
    uv_freeaddrinfo(req->addrinfo);
    luv_cleanup_req(L, (luv_req_t*)req->data);
  }
  return 1;
}